

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall
QFormLayoutPrivate::setLayout(QFormLayoutPrivate *this,int row,ItemRole role,QLayout *layout)

{
  bool bVar1;
  long in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QFormLayoutPrivate *in_RDI;
  QFormLayoutPrivate *unaff_retaddr;
  QFormLayout *q;
  QLayout *in_stack_ffffffffffffffc8;
  QLayout *in_stack_ffffffffffffffd0;
  
  if (in_RCX != 0) {
    q_func(in_RDI);
    bVar1 = QLayout::adoptLayout(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (bVar1) {
      setItem(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(ItemRole)in_RDI,
              (QLayoutItem *)CONCAT44(in_ESI,in_EDX));
    }
  }
  return;
}

Assistant:

void QFormLayoutPrivate::setLayout(int row, QFormLayout::ItemRole role, QLayout *layout)
{
    if (layout) {
        Q_Q(QFormLayout);
        if (q->adoptLayout(layout))
            setItem(row, role, layout);
    }
}